

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask3_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  
  uVar1 = in[10];
  uVar2 = in[0xe];
  uVar3 = in[0xc];
  *out = uVar1 << 0x1e | in[9] << 0x1b | in[8] << 0x18 | in[7] << 0x15 |
         in[6] << 0x12 | in[5] << 0xf | in[4] << 0xc | in[3] << 9 | in[2] << 6 | in[1] << 3 | *in;
  uVar4 = in[0x15];
  uVar5 = in[0x16];
  uVar6 = in[0x17];
  out[1] = uVar4 << 0x1f |
           in[0x14] << 0x1c | in[0x13] << 0x19 | in[0x12] << 0x16 | in[0x11] << 0x13 |
           in[0x10] << 0x10 | in[0xf] << 0xd | uVar2 << 10 |
           in[0xd] << 7 | uVar3 << 4 | in[0xb] * 2 | uVar1 >> 2;
  out[2] = uVar6 << 5 | uVar5 << 2 | uVar4 >> 1;
  return out + 3;
}

Assistant:

uint32_t *__fastpackwithoutmask3_24(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 27;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (3 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 19;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 25;
  ++in;
  *out |= ((*in)) << 28;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (3 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 5;
  ++in;

  return out + 1;
}